

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

Transaction *
cfd::core::Psbt::RebuildTransaction(Transaction *__return_storage_ptr__,void *wally_psbt_pointer)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_68;
  Transaction local_50;
  
  Transaction::Transaction(__return_storage_ptr__);
  if ((wally_psbt_pointer != (void *)0x0) &&
     (*(wally_tx **)((long)wally_psbt_pointer + 8) != (wally_tx *)0x0)) {
    ConvertBitcoinTxFromWally
              ((ByteData *)&_Stack_68,*(wally_tx **)((long)wally_psbt_pointer + 8),false);
    Transaction::Transaction(&local_50,(ByteData *)&_Stack_68);
    Transaction::operator=(__return_storage_ptr__,&local_50);
    Transaction::~Transaction(&local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Transaction Psbt::RebuildTransaction(const void *wally_psbt_pointer) {
  Transaction tx;
  if (wally_psbt_pointer != nullptr) {
    const struct wally_psbt *psbt_pointer;
    psbt_pointer = static_cast<const struct wally_psbt *>(wally_psbt_pointer);
    if (psbt_pointer->tx != nullptr) {
      tx = Transaction(ConvertBitcoinTxFromWally(psbt_pointer->tx, false));
    }
  }
  return tx;
}